

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

PowBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_powbroadcastable(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x375) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x375;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    PowBroadcastableLayerParams::PowBroadcastableLayerParams(this_00.powbroadcastable_);
    (this->layer_).powbroadcastable_ = (PowBroadcastableLayerParams *)this_00;
  }
  return (PowBroadcastableLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::PowBroadcastableLayerParams* NeuralNetworkLayer::mutable_powbroadcastable() {
  if (!has_powbroadcastable()) {
    clear_layer();
    set_has_powbroadcastable();
    layer_.powbroadcastable_ = new ::CoreML::Specification::PowBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.powBroadcastable)
  return layer_.powbroadcastable_;
}